

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECPrivateKey.cpp
# Opt level: O0

void __thiscall OSSLECPrivateKey::setFromOSSL(OSSLECPrivateKey *this,EC_KEY *inECKEY)

{
  BIGNUM *bn;
  EC_KEY *in_RSI;
  long *in_RDI;
  ByteString inD;
  BIGNUM *pk;
  ByteString inEC;
  EC_GROUP *grp;
  undefined1 local_80 [40];
  EC_GROUP *in_stack_ffffffffffffffa8;
  undefined1 local_40 [40];
  EC_GROUP *local_18;
  EC_KEY *local_10;
  
  local_10 = in_RSI;
  local_18 = EC_KEY_get0_group(in_RSI);
  if (local_18 != (EC_GROUP *)0x0) {
    OSSL::grp2ByteString(in_stack_ffffffffffffffa8);
    (**(code **)(*in_RDI + 0x50))(in_RDI,local_40);
    ByteString::~ByteString((ByteString *)0x12ce1a);
  }
  bn = EC_KEY_get0_private_key(local_10);
  if (bn != (BIGNUM *)0x0) {
    OSSL::bn2ByteString((BIGNUM *)bn);
    (**(code **)(*in_RDI + 0x48))(in_RDI,local_80);
    ByteString::~ByteString((ByteString *)0x12ce81);
  }
  return;
}

Assistant:

void OSSLECPrivateKey::setFromOSSL(const EC_KEY* inECKEY)
{
	const EC_GROUP* grp = EC_KEY_get0_group(inECKEY);
	if (grp != NULL)
	{
		ByteString inEC = OSSL::grp2ByteString(grp);
		setEC(inEC);
	}
	const BIGNUM* pk = EC_KEY_get0_private_key(inECKEY);
	if (pk != NULL)
	{
		ByteString inD = OSSL::bn2ByteString(pk);
		setD(inD);
	}
}